

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

void cfd::api::CollectUtxoDataByFundRawTransaction
               (ConfidentialTransactionContext *ctx,
               vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
               *selected_txin_utxos,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *txin_amount_map,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *tx_amount_map,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_list,int32_t *fee_index)

{
  initializer_list<cfd::core::OutPoint> __l;
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  size_type sVar7;
  long lVar8;
  mapped_type *pmVar9;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined8 in_RSI;
  undefined4 *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  pVar10;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *outpoint_list_1;
  OutPoint outpoint_1;
  string asset_2;
  ConfidentialAssetId asset_id;
  string token_unblind;
  string token_blind;
  ConfidentialAssetId token2;
  ConfidentialAssetId token1;
  string token;
  BlindFactor asset_entropy;
  ConfidentialTxInReference *txin_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range2_1;
  int64_t amount_1;
  OutPoint outpoint;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> outpoint_list;
  string asset_1;
  ConfidentialTxInReference *txin;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range3;
  ElementsUtxoAndOption *elements_utxo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *__range2;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txin_list;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  asset_utxo_map;
  int64_t amount;
  string asset;
  value_type *txout;
  size_t index;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txout_list;
  ConfidentialTxInReference *in_stack_fffffffffffff698;
  Script *in_stack_fffffffffffff6a0;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  __normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
  in_stack_fffffffffffff6b0;
  __normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
  in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6cc;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_fffffffffffff6d0;
  key_type *in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e7;
  undefined6 in_stack_fffffffffffff738;
  undefined1 in_stack_fffffffffffff73e;
  undefined1 in_stack_fffffffffffff73f;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_fffffffffffff740;
  byte local_86a;
  OutPoint *local_7f8;
  Txid local_708;
  OutPoint local_6e8;
  _Base_ptr local_6c0;
  undefined1 local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined8 local_678;
  undefined1 local_670;
  key_type *local_668;
  _Self local_660;
  _Self local_658;
  _Base_ptr local_650;
  undefined1 local_648;
  undefined8 local_640;
  undefined1 local_638;
  undefined8 local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  _Self local_5f0;
  _Self local_5e8;
  _Base_ptr local_5e0;
  undefined1 local_5d8;
  undefined8 local_5d0;
  undefined1 local_5c8;
  undefined8 local_598;
  undefined1 local_590;
  undefined8 local_588;
  _Self local_580;
  _Self local_578 [4];
  string local_558 [32];
  BlindFactor local_538;
  ByteData256 local_510;
  BlindFactor local_4f8;
  _Self local_4d8;
  _Self local_4d0;
  _Self local_4c8;
  _Self local_4c0;
  string local_4b8 [32];
  string local_498 [32];
  BlindFactor local_478;
  BlindFactor local_450 [2];
  undefined1 local_410 [32];
  BlindFactor local_3f0;
  string local_3b8 [32];
  BlindFactor local_398;
  byte local_371;
  reference local_340;
  ConfidentialTxInReference *local_338;
  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_330;
  undefined1 *local_328;
  _Base_ptr local_320;
  undefined1 local_318;
  undefined8 local_310;
  _Self local_308;
  _Self local_300;
  OutPoint local_2f8;
  OutPoint *local_2c8;
  OutPoint local_2c0;
  OutPoint local_298;
  _Self local_270;
  _Self local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  string local_240 [32];
  Txid local_220;
  reference local_200;
  ConfidentialTxInReference *local_1f8;
  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_1f0;
  undefined1 *local_1e8;
  reference local_1e0;
  ElementsUtxoAndOption *local_1d8;
  __normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
  local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [72];
  undefined8 local_178;
  undefined1 local_170;
  undefined8 local_140;
  undefined1 local_138;
  _Base_ptr local_130;
  undefined1 local_128;
  undefined8 local_120;
  _Self local_118;
  _Self local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string local_c0 [104];
  const_reference local_58;
  ulong local_50;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_48 [24];
  undefined4 *local_30;
  undefined8 local_10;
  
  local_30 = in_R9;
  local_10 = in_RSI;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  for (local_50 = 0; uVar1 = local_50,
      sVar7 = std::
              vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ::size(local_48), uVar1 < sVar7; local_50 = local_50 + 1) {
    local_58 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::operator[](local_48,local_50);
    core::AbstractTxOutReference::GetLockingScript
              ((AbstractTxOutReference *)in_stack_fffffffffffff698);
    bVar2 = cfd::core::Script::IsEmpty();
    core::Script::~Script(in_stack_fffffffffffff6a0);
    if ((bVar2 & 1) == 0) {
      core::ConfidentialTxOutReference::GetAsset
                ((ConfidentialTxOutReference *)in_stack_fffffffffffff698);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x422500);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff698);
      local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff698);
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )in_stack_fffffffffffff6b8._M_current,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )in_stack_fffffffffffff6b0._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
      local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff698);
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff6a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff698);
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6b0._M_current,
                    (value_type *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
      }
      local_110._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   *)in_stack_fffffffffffff698,(key_type *)0x4225fe);
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)in_stack_fffffffffffff698);
      bVar3 = std::operator==(&local_110,&local_118);
      if (bVar3) {
        local_120 = 0;
        pVar10 = std::
                 map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                 ::emplace<std::__cxx11::string&,long&>
                           ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                             *)in_stack_fffffffffffff6b0._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                            (long *)in_stack_fffffffffffff6a0);
        local_130 = (_Base_ptr)pVar10.first._M_node;
        local_128 = pVar10.second;
      }
      core::ConfidentialTxOutReference::GetConfidentialValue
                ((ConfidentialTxOutReference *)in_stack_fffffffffffff698);
      local_178 = cfd::core::ConfidentialValue::GetAmount();
      local_170 = extraout_DL;
      local_140 = local_178;
      local_138 = extraout_DL;
      lVar8 = cfd::core::Amount::GetSatoshiValue();
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                            in_stack_fffffffffffff6d8);
      *pmVar9 = lVar8 + *pmVar9;
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x42276a);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      *local_30 = (int)local_50;
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
         *)0x4227d4);
  cfd::core::ConfidentialTransaction::GetTxInList();
  local_1c8 = local_10;
  local_1d0._M_current =
       (ElementsUtxoAndOption *)
       std::
       vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
       begin((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              *)in_stack_fffffffffffff698);
  local_1d8 = (ElementsUtxoAndOption *)
              std::
              vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              ::end((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                     *)in_stack_fffffffffffff698);
  do {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
                        *)in_stack_fffffffffffff6a0,
                       (__normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
                        *)in_stack_fffffffffffff698);
    if (!bVar3) {
      local_328 = local_1c0;
      local_330._M_current =
           (ConfidentialTxInReference *)
           std::
           vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
           ::begin(in_stack_fffffffffffff698);
      local_338 = (ConfidentialTxInReference *)
                  std::
                  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                  ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                         *)in_stack_fffffffffffff698);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                                 *)in_stack_fffffffffffff6a0,
                                (__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                                 *)in_stack_fffffffffffff698), bVar3) {
        local_340 = __gnu_cxx::
                    __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                    ::operator*(&local_330);
        local_371 = 0;
        core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffff698);
        bVar2 = cfd::core::ByteData256::IsEmpty();
        local_86a = 1;
        if ((bVar2 & 1) != 0) {
          core::ConfidentialTxInReference::GetAssetEntropy(in_stack_fffffffffffff698);
          local_371 = 1;
          local_86a = cfd::core::ByteData256::IsEmpty();
          local_86a = local_86a ^ 0xff;
        }
        if ((local_371 & 1) != 0) {
          core::ByteData256::~ByteData256((ByteData256 *)0x423056);
        }
        core::ByteData256::~ByteData256((ByteData256 *)0x423063);
        if ((local_86a & 1) != 0) {
          cfd::core::BlindFactor::BlindFactor(&local_398);
          std::__cxx11::string::string(local_3b8);
          core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffff698);
          bVar2 = cfd::core::ByteData256::IsEmpty();
          core::ByteData256::~ByteData256((ByteData256 *)0x4230c9);
          if ((bVar2 & 1) == 0) {
            core::ConfidentialTxInReference::GetAssetEntropy(in_stack_fffffffffffff698);
            cfd::core::BlindFactor::BlindFactor(&local_4f8,&local_510);
            cfd::core::BlindFactor::operator=(&local_398,&local_4f8);
            core::BlindFactor::~BlindFactor((BlindFactor *)0x423506);
            core::ByteData256::~ByteData256((ByteData256 *)0x423513);
          }
          else {
            core::AbstractTxInReference::GetTxid
                      (&in_stack_fffffffffffff698->super_AbstractTxInReference);
            uVar6 = core::AbstractTxInReference::GetVout(&local_340->super_AbstractTxInReference);
            core::ConfidentialTxInReference::GetAssetEntropy(in_stack_fffffffffffff698);
            cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                      ((Txid *)&local_3f0,(uint)local_410,(ByteData256 *)(ulong)uVar6);
            cfd::core::BlindFactor::operator=(&local_398,&local_3f0);
            core::BlindFactor::~BlindFactor((BlindFactor *)0x423167);
            core::ByteData256::~ByteData256((ByteData256 *)0x423174);
            core::Txid::~Txid((Txid *)0x423181);
            cfd::core::ConfidentialTransaction::CalculateReissuanceToken
                      (local_450,SUB81(&local_398,0));
            cfd::core::ConfidentialTransaction::CalculateReissuanceToken
                      (&local_478,SUB81(&local_398,0));
            cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
            cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
            local_4c0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)in_stack_fffffffffffff698,(key_type *)0x4231f9);
            local_4c8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        *)in_stack_fffffffffffff698);
            bVar3 = std::operator!=(&local_4c0,&local_4c8);
            if (bVar3) {
              std::__cxx11::string::operator=(local_3b8,local_498);
            }
            else {
              local_4d0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)in_stack_fffffffffffff698,(key_type *)0x4233ea);
              local_4d8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)in_stack_fffffffffffff698);
              bVar3 = std::operator!=(&local_4d0,&local_4d8);
              if (bVar3) {
                std::__cxx11::string::operator=(local_3b8,local_4b8);
              }
            }
            std::__cxx11::string::~string(local_4b8);
            std::__cxx11::string::~string(local_498);
            core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x423476);
            core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x423483);
          }
          cfd::core::ConfidentialTransaction::CalculateAsset(&local_538);
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffff698);
          bVar2 = cfd::core::ByteData256::IsEmpty();
          core::ByteData256::~ByteData256((ByteData256 *)0x4235c6);
          if ((bVar2 & 1) == 0) {
            local_658._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)in_stack_fffffffffffff698,(key_type *)0x423977);
            local_660._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        *)in_stack_fffffffffffff698);
            bVar3 = std::operator==(&local_658,&local_660);
            if (bVar3) {
              core::ConfidentialTxInReference::GetIssuanceAmount(in_stack_fffffffffffff698);
              local_6b0 = cfd::core::ConfidentialValue::GetAmount();
              in_stack_fffffffffffff6e7 = extraout_DL_02;
              local_6a8 = extraout_DL_02;
              local_678 = local_6b0;
              local_670 = extraout_DL_02;
              in_stack_fffffffffffff6d8 = (key_type *)cfd::core::Amount::GetSatoshiValue();
              local_668 = in_stack_fffffffffffff6d8;
              pVar10 = std::
                       map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                       ::emplace<std::__cxx11::string&,long>
                                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                   *)in_stack_fffffffffffff6b0._M_current,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                                  (long *)in_stack_fffffffffffff6a0);
              local_6c0 = (_Base_ptr)pVar10.first._M_node;
              local_6b8 = pVar10.second;
              core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x423a9b);
            }
            else {
              core::AbstractTxInReference::GetTxid
                        (&in_stack_fffffffffffff698->super_AbstractTxInReference);
              uVar6 = core::AbstractTxInReference::GetVout(&local_340->super_AbstractTxInReference);
              cfd::core::OutPoint::OutPoint(&local_6e8,&local_708,uVar6);
              core::Txid::~Txid((Txid *)0x423b18);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                           in_stack_fffffffffffff6d8);
              std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::begin
                        ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                         in_stack_fffffffffffff698);
              std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::end
                        ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                         in_stack_fffffffffffff698);
              in_stack_fffffffffffff6b8 =
                   std::
                   find<__gnu_cxx::__normal_iterator<cfd::core::OutPoint*,std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>>,cfd::core::OutPoint>
                             (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                              (OutPoint *)
                              CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
              std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::end
                        ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                         in_stack_fffffffffffff698);
              bVar3 = __gnu_cxx::operator==
                                ((__normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
                                  *)in_stack_fffffffffffff6a0,
                                 (__normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
                                  *)in_stack_fffffffffffff698);
              if (bVar3) {
                core::ConfidentialTxInReference::GetIssuanceAmount(in_stack_fffffffffffff698);
                in_stack_fffffffffffff6b0._M_current =
                     (OutPoint *)cfd::core::ConfidentialValue::GetAmount();
                in_stack_fffffffffffff6af = extraout_DL_03;
                in_stack_fffffffffffff6a0 = (Script *)cfd::core::Amount::GetSatoshiValue();
                in_stack_fffffffffffff698 =
                     (ConfidentialTxInReference *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                                  in_stack_fffffffffffff6d8);
                (in_stack_fffffffffffff698->super_AbstractTxInReference)._vptr_AbstractTxInReference
                     = (_func_int **)
                       ((long)&in_stack_fffffffffffff6a0->_vptr_Script +
                       (long)(in_stack_fffffffffffff698->super_AbstractTxInReference).
                             _vptr_AbstractTxInReference);
                core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x423c7f);
              }
              core::OutPoint::~OutPoint((OutPoint *)0x423ced);
            }
          }
          else {
            local_578[0]._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)in_stack_fffffffffffff698,(key_type *)0x4235eb);
            local_580._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        *)in_stack_fffffffffffff698);
            bVar3 = std::operator==(local_578,&local_580);
            if (bVar3) {
              core::ConfidentialTxInReference::GetIssuanceAmount(in_stack_fffffffffffff698);
              local_5d0 = cfd::core::ConfidentialValue::GetAmount();
              local_5c8 = extraout_DL_00;
              local_598 = local_5d0;
              local_590 = extraout_DL_00;
              local_588 = cfd::core::Amount::GetSatoshiValue();
              pVar10 = std::
                       map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                       ::emplace<std::__cxx11::string&,long>
                                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                   *)in_stack_fffffffffffff6b0._M_current,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                                  (long *)in_stack_fffffffffffff6a0);
              local_5e0 = (_Base_ptr)pVar10.first._M_node;
              local_5d8 = pVar10.second;
              core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x423739);
            }
            uVar5 = std::__cxx11::string::empty();
            bVar3 = false;
            if ((uVar5 & 1) == 0) {
              local_5e8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)in_stack_fffffffffffff698,(key_type *)0x4237eb);
              local_5f0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)in_stack_fffffffffffff698);
              bVar3 = std::operator==(&local_5e8,&local_5f0);
            }
            if (bVar3 != false) {
              core::ConfidentialTxInReference::GetInflationKeys(in_stack_fffffffffffff698);
              local_640 = cfd::core::ConfidentialValue::GetAmount();
              local_638 = extraout_DL_01;
              local_608 = local_640;
              local_600 = extraout_DL_01;
              local_5f8 = cfd::core::Amount::GetSatoshiValue();
              pVar10 = std::
                       map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                       ::emplace<std::__cxx11::string&,long>
                                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                   *)in_stack_fffffffffffff6b0._M_current,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                                  (long *)in_stack_fffffffffffff6a0);
              local_650 = (_Base_ptr)pVar10.first._M_node;
              local_648 = pVar10.second;
              core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x423935);
            }
          }
          std::__cxx11::string::~string(local_558);
          core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x423d1a);
          std::__cxx11::string::~string(local_3b8);
          core::BlindFactor::~BlindFactor((BlindFactor *)0x423d34);
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
        ::operator++(&local_330);
      }
      std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                 *)in_stack_fffffffffffff6b0._M_current);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
              *)0x423d9a);
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 *)in_stack_fffffffffffff6b0._M_current);
      return;
    }
    local_1e0 = __gnu_cxx::
                __normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
                ::operator*(&local_1d0);
    local_1e8 = local_1c0;
    local_1f0._M_current =
         (ConfidentialTxInReference *)
         std::
         vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
         ::begin(in_stack_fffffffffffff698);
    local_1f8 = (ConfidentialTxInReference *)
                std::
                vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                       *)in_stack_fffffffffffff698);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                          *)in_stack_fffffffffffff6a0,
                         (__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                          *)in_stack_fffffffffffff698);
      if (!bVar3) goto LAB_00422f1d;
      local_200 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                  ::operator*(&local_1f0);
      core::AbstractTxInReference::GetTxid(&in_stack_fffffffffffff698->super_AbstractTxInReference);
      bVar2 = cfd::core::Txid::Equals(&local_220);
      bVar3 = false;
      if ((bVar2 & 1) != 0) {
        uVar6 = (local_1e0->utxo).vout;
        uVar4 = core::AbstractTxInReference::GetVout(&local_200->super_AbstractTxInReference);
        bVar3 = uVar6 == uVar4;
      }
      core::Txid::~Txid((Txid *)0x422972);
      if (bVar3) break;
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
      ::operator++(&local_1f0);
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff698);
    local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff698);
    local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )in_stack_fffffffffffff6b8._M_current,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )in_stack_fffffffffffff6b0._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff698);
    bVar3 = __gnu_cxx::operator==
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff6a0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff698);
    if (bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6b0._M_current,
                  (value_type *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    }
    local_268._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                 *)in_stack_fffffffffffff698,(key_type *)0x422ad3);
    local_270._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                *)in_stack_fffffffffffff698);
    bVar3 = std::operator==(&local_268,&local_270);
    if (bVar3) {
      local_2c8 = &local_2c0;
      cfd::core::OutPoint::OutPoint(local_2c8,&(local_1e0->utxo).txid,(local_1e0->utxo).vout);
      local_298.txid_._vptr_Txid = (_func_int **)&local_2c0;
      local_298.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      std::allocator<cfd::core::OutPoint>::allocator((allocator<cfd::core::OutPoint> *)0x422b7a);
      __l._M_len._0_7_ = in_stack_fffffffffffff6e0;
      __l._M_array = (iterator)in_stack_fffffffffffff6d8;
      __l._M_len._7_1_ = in_stack_fffffffffffff6e7;
      std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
                (in_stack_fffffffffffff6d0,__l,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
      std::allocator<cfd::core::OutPoint>::~allocator((allocator<cfd::core::OutPoint> *)0x422bae);
      local_7f8 = &local_298;
      do {
        local_7f8 = local_7f8 + -1;
        core::OutPoint::~OutPoint((OutPoint *)0x422be3);
      } while (local_7f8 != &local_2c0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                   in_stack_fffffffffffff6d8);
      std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
                (in_stack_fffffffffffff740,
                 (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                 CONCAT17(in_stack_fffffffffffff73f,
                          CONCAT16(in_stack_fffffffffffff73e,in_stack_fffffffffffff738)));
      std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::~vector
                ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                 in_stack_fffffffffffff6b0._M_current);
    }
    else {
      cfd::core::OutPoint::OutPoint(&local_2f8,&(local_1e0->utxo).txid,(local_1e0->utxo).vout);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                   in_stack_fffffffffffff6d8);
      std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::push_back
                ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                 in_stack_fffffffffffff6b0._M_current,
                 (value_type *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
      core::OutPoint::~OutPoint((OutPoint *)0x422db6);
    }
    local_300._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)in_stack_fffffffffffff698,(key_type *)0x422df3);
    local_308._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)in_stack_fffffffffffff698);
    bVar3 = std::operator==(&local_300,&local_308);
    if (bVar3) {
      local_310 = 0;
      pVar10 = std::
               map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
               ::emplace<std::__cxx11::string&,long&>
                         ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)in_stack_fffffffffffff6b0._M_current,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
                          (long *)in_stack_fffffffffffff6a0);
      local_320 = (_Base_ptr)pVar10.first._M_node;
      local_318 = pVar10.second;
    }
    lVar8 = cfd::core::Amount::GetSatoshiValue();
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                          in_stack_fffffffffffff6d8);
    *pmVar9 = lVar8 + *pmVar9;
    std::__cxx11::string::~string(local_240);
LAB_00422f1d:
    __gnu_cxx::
    __normal_iterator<const_cfd::api::ElementsUtxoAndOption_*,_std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>_>
    ::operator++(&local_1d0);
  } while( true );
}

Assistant:

void CollectUtxoDataByFundRawTransaction(
    const ConfidentialTransactionContext& ctx,
    const std::vector<ElementsUtxoAndOption>& selected_txin_utxos,
    std::map<std::string, int64_t>* txin_amount_map,
    std::map<std::string, int64_t>* tx_amount_map,
    std::vector<std::string>* asset_list, int32_t* fee_index) {
  const auto txout_list = ctx.GetTxOutList();
  for (size_t index = 0; index < txout_list.size(); ++index) {
    auto& txout = txout_list[index];
    if (txout.GetLockingScript().IsEmpty()) {
      // Excludes fees from collection
      *fee_index = static_cast<int32_t>(index);
    } else {
      std::string asset = txout.GetAsset().GetHex();
      if (std::find(asset_list->begin(), asset_list->end(), asset) ==
          asset_list->end()) {
        asset_list->push_back(asset);
      }

      if (tx_amount_map->find(asset) == tx_amount_map->end()) {
        int64_t amount = 0;
        tx_amount_map->emplace(asset, amount);
      }
      (*tx_amount_map)[asset] +=
          txout.GetConfidentialValue().GetAmount().GetSatoshiValue();
    }
  }
  std::map<std::string, std::vector<OutPoint>> asset_utxo_map;
  const auto txin_list = ctx.GetTxInList();  // txin_utxo_list
  for (const auto& elements_utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(elements_utxo.utxo.txid)) &&
          (elements_utxo.utxo.vout == txin.GetVout())) {
        std::string asset = elements_utxo.utxo.asset.GetHex();
        if (std::find(asset_list->begin(), asset_list->end(), asset) ==
            asset_list->end()) {
          asset_list->push_back(asset);
        }
        if (asset_utxo_map.find(asset) == asset_utxo_map.end()) {
          std::vector<OutPoint> outpoint_list = {
              OutPoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout)};
          asset_utxo_map[asset] = outpoint_list;
        } else {
          OutPoint outpoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout);
          asset_utxo_map[asset].push_back(outpoint);
        }

        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          int64_t amount = 0;
          txin_amount_map->emplace(asset, amount);
        }
        (*txin_amount_map)[asset] +=
            elements_utxo.utxo.amount.GetSatoshiValue();
        break;
      }
    }
  }

  // append issuance txin data.
  for (const auto& txin : txin_list) {
    if (!txin.GetBlindingNonce().IsEmpty() ||
        !txin.GetAssetEntropy().IsEmpty()) {
      BlindFactor asset_entropy;
      std::string token;
      if (txin.GetBlindingNonce().IsEmpty()) {
        asset_entropy = ConfidentialTransaction::CalculateAssetEntropy(
            txin.GetTxid(), txin.GetVout(), txin.GetAssetEntropy());
        ConfidentialAssetId token1 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, true);
        ConfidentialAssetId token2 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, false);
        std::string token_blind = token1.GetHex();
        std::string token_unblind = token2.GetHex();
        if (tx_amount_map->find(token_blind) != tx_amount_map->end()) {
          token = token_blind;
        } else if (
            tx_amount_map->find(token_unblind) != tx_amount_map->end()) {
          token = token_unblind;
        }
      } else {
        asset_entropy = BlindFactor(txin.GetAssetEntropy());
      }
      ConfidentialAssetId asset_id =
          ConfidentialTransaction::CalculateAsset(asset_entropy);
      std::string asset = asset_id.GetHex();

      if (txin.GetBlindingNonce().IsEmpty()) {
        // At the time of issuance, add to map if it is not registered.
        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          txin_amount_map->emplace(
              asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
        }
        if ((!token.empty()) &&
            (txin_amount_map->find(token) == txin_amount_map->end())) {
          txin_amount_map->emplace(
              token, txin.GetInflationKeys().GetAmount().GetSatoshiValue());
        }
      } else if (txin_amount_map->find(asset) == txin_amount_map->end()) {
        // At the time of reissuance, add to map if it is not registered asset.
        txin_amount_map->emplace(
            asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
      } else {
        // At the time of reissuance,
        // add to map if it is not registered asset of utxo.
        OutPoint outpoint(txin.GetTxid(), txin.GetVout());
        std::vector<OutPoint>& outpoint_list = asset_utxo_map[asset];
        if (std::find(outpoint_list.begin(), outpoint_list.end(), outpoint) ==
            outpoint_list.end()) {
          (*txin_amount_map)[asset] +=
              txin.GetIssuanceAmount().GetAmount().GetSatoshiValue();
        }
      }
    }
  }
}